

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O1

void __thiscall
ObserverManager_TwoProtocolsSubscribe_Test::~ObserverManager_TwoProtocolsSubscribe_Test
          (ObserverManager_TwoProtocolsSubscribe_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ObserverManager, TwoProtocolsSubscribe) {
    std::stringstream out;

    B* b = new B(out);
    ObserverManager::subscribe<TicTacProtocol>(b);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Toe");
    
    delete b;

    EXPECT_EQ("Tic Tac Toe ", out.str());
}